

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O0

void relational_operator<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *t1,
               char *s1,map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *t2,char *s2)

{
  bool bVar1;
  ostream *poVar2;
  char *s2_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *t2_local;
  char *s1_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *t1_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,s1);
  poVar2 = std::operator<<(poVar2," is...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"equal to");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator!=(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"not equal to");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator<(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"smaller than");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator<=(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"smaller than or equal to");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator>(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"greater than");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator>=(t1,t2);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"greater than or equal to");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,s2);
  poVar2 = std::operator<<(poVar2,"!\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}